

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileSystemListView.cpp
# Opt level: O0

void QFileSystemListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  Section *pSVar3;
  bool bVar4;
  Filters FVar5;
  Section SVar6;
  QList<QString> *this;
  QFileSystemListView *this_00;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  QFileSystemListView *in_RDI;
  void *_v_1;
  QFileSystemListView *_t_2;
  void *_v;
  QFileSystemListView *_t_1;
  int *result;
  QFileSystemListView *_t;
  QFileSystemListView *in_stack_ffffffffffffff68;
  QFileSystemListView *in_stack_ffffffffffffff70;
  Section in_stack_ffffffffffffff7c;
  QFileSystemListView *in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QFileSystemListView *in_stack_ffffffffffffffa0;
  bool in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      directoryLoaded(in_stack_ffffffffffffff80,
                      (QString *)((ulong)in_stack_ffffffffffffff7c << 0x20));
    }
    else if (in_EDX == 1) {
      fileRenamed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                  in_stack_ffffffffffffff88);
    }
    else if (in_EDX == 2) {
      rootPathChanged(in_stack_ffffffffffffff80,(QString *)CONCAT44(in_stack_ffffffffffffff7c,2));
    }
  }
  else if (in_ESI == 5) {
    puVar1 = (undefined4 *)*in_RCX;
    pcVar2 = *(code **)in_RCX[1];
    if (pcVar2 == directoryLoaded && (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *(code **)in_RCX[1];
      if (pcVar2 == fileRenamed && (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *(code **)in_RCX[1];
        if (pcVar2 == rootPathChanged && (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
          *puVar1 = 2;
        }
      }
    }
  }
  else if (in_ESI == 1) {
    pSVar3 = (Section *)*in_RCX;
    this = (QList<QString> *)(ulong)in_EDX;
    switch(this) {
    case (QList<QString> *)0x0:
      bVar4 = nameFilterDisables((QFileSystemListView *)0x1d9319);
      *(bool *)pSVar3 = bVar4;
      break;
    case (QList<QString> *)0x1:
      bVar4 = readOnly((QFileSystemListView *)0x1d9334);
      *(bool *)pSVar3 = bVar4;
      break;
    case (QList<QString> *)0x2:
      bVar4 = resolveSymlinks((QFileSystemListView *)0x1d934f);
      *(bool *)pSVar3 = bVar4;
      break;
    case (QList<QString> *)0x3:
      bVar4 = browsable(in_RDI);
      *(bool *)pSVar3 = bVar4;
      break;
    case (QList<QString> *)0x4:
      FVar5 = filters(in_stack_ffffffffffffff68);
      *pSVar3 = FVar5.i;
      break;
    case (QList<QString> *)0x5:
      nameFilters(in_stack_ffffffffffffff68);
      QList<QString>::operator=(this,(QList<QString> *)in_stack_ffffffffffffff68);
      QList<QString>::~QList((QList<QString> *)0x1d93be);
      break;
    case (QList<QString> *)0x6:
      SVar6 = visibleSection(in_stack_ffffffffffffff68);
      *pSVar3 = SVar6;
      break;
    case (QList<QString> *)0x7:
      rootPath(in_stack_ffffffffffffff68);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff68);
      QString::~QString((QString *)0x1d93fd);
    }
  }
  else if (in_ESI == 2) {
    this_00 = (QFileSystemListView *)(ulong)in_EDX;
    switch(this_00) {
    case (QFileSystemListView *)0x0:
      setNameFilterDisables(in_stack_ffffffffffffff70,false);
      break;
    case (QFileSystemListView *)0x1:
      setReadOnly(in_stack_ffffffffffffff70,false);
      break;
    case (QFileSystemListView *)0x2:
      setResolveSymlinks(in_stack_ffffffffffffff70,false);
      break;
    case (QFileSystemListView *)0x3:
      setBrowsable((QFileSystemListView *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbf);
      break;
    case (QFileSystemListView *)0x4:
      setFilters(this_00,(Filters)(Int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      break;
    case (QFileSystemListView *)0x5:
      setNameFilters(in_stack_ffffffffffffff70,(QStringList *)this_00);
      break;
    case (QFileSystemListView *)0x6:
      setVisibleSection((QFileSystemListView *)*in_RCX,in_stack_ffffffffffffff7c);
      break;
    case (QFileSystemListView *)0x7:
      setRootPath(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void QFileSystemListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileSystemListView::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::directoryLoaded)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QFileSystemListView::*)(const QString & , const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::fileRenamed)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QFileSystemListView::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::rootPathChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->nameFilterDisables(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->readOnly(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->resolveSymlinks(); break;
        case 3: *reinterpret_cast< bool*>(_v) = _t->browsable(); break;
        case 4: *reinterpret_cast< QDir::Filters*>(_v) = _t->filters(); break;
        case 5: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 6: *reinterpret_cast< QFileSystemListView::Section*>(_v) = _t->visibleSection(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->rootPath(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFilterDisables(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setResolveSymlinks(*reinterpret_cast< bool*>(_v)); break;
        case 3: _t->setBrowsable(*reinterpret_cast< bool*>(_v)); break;
        case 4: _t->setFilters(*reinterpret_cast< QDir::Filters*>(_v)); break;
        case 5: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 6: _t->setVisibleSection(*reinterpret_cast< QFileSystemListView::Section*>(_v)); break;
        case 7: _t->setRootPath(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}